

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void io_read_all(IOHANDLE io,void **result,uint *result_len)

{
  void *__ptr;
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong __size;
  
  __ptr = malloc(0x400);
  *result = (void *)0x0;
  *result_len = 0;
  __size = 0x400;
  uVar3 = 0;
  while( true ) {
    uVar2 = (uint)uVar3;
    uVar4 = (uint)__size;
    sVar1 = fread((void *)((long)__ptr + uVar3),1,(ulong)(uVar4 - uVar2),(FILE *)io);
    if ((int)sVar1 == 0) break;
    uVar2 = uVar2 + (int)sVar1;
    uVar3 = (ulong)uVar2;
    if (uVar2 == uVar4) {
      __size = (ulong)(uVar4 * 2);
      __ptr = realloc(__ptr,__size);
    }
  }
  if (uVar4 == uVar2) {
    __ptr = realloc(__ptr,(ulong)(uVar2 + 1));
  }
  *(undefined1 *)((long)__ptr + uVar3) = 0;
  *result = __ptr;
  *result_len = uVar2;
  return;
}

Assistant:

void io_read_all(IOHANDLE io, void **result, unsigned *result_len)
{
	unsigned char *buffer = malloc(1024);
	unsigned len = 0;
	unsigned cap = 1024;
	unsigned read;

	*result = 0;
	*result_len = 0;

	while((read = io_read(io, buffer + len, cap - len)) != 0)
	{
		len += read;
		if(len == cap)
		{
			cap *= 2;
			buffer = realloc(buffer, cap);
		}
	}
	if(len == cap)
	{
		buffer = realloc(buffer, cap + 1);
	}
	// ensure null termination
	buffer[len] = 0;
	*result = buffer;
	*result_len = len;
}